

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O3

void __thiscall
pzgeom::TPZTriangleTorus::X<Fad<double>>
          (TPZTriangleTorus *this,TPZFMatrix<double> *coord,TPZVec<Fad<double>_> *loc,
          TPZVec<Fad<double>_> *result)

{
  REAL RVar1;
  REAL RVar2;
  double dVar3;
  long lVar4;
  TPZVec<Fad<double>_> toro;
  FadExpr<FadFuncCos<Fad<double>_>_> local_108;
  undefined1 local_e0 [24];
  double *pdStack_c8;
  undefined1 local_b8 [16];
  double *local_a8;
  FadExpr<FadFuncSin<Fad<double>_>_> *local_a0;
  TPZVec<Fad<double>_> local_98;
  FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>
  local_78;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_> local_58;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>
  local_38;
  
  TPZGeoTriangle::X<Fad<double>>(&(this->fPhiTheta).super_TPZFMatrix<double>,loc,result);
  local_e0._0_8_ = 0.0;
  local_e0._8_4_ = 0;
  local_e0._16_8_ = (double *)0x0;
  pdStack_c8 = (double *)0x0;
  TPZVec<Fad<double>_>::TPZVec(&local_98,3,(Fad<double> *)local_e0);
  Fad<double>::~Fad((Fad<double> *)local_e0);
  RVar1 = this->fR;
  RVar2 = this->fr;
  FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)&local_108,result->fStore);
  FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_e0,(FadFuncCos<Fad<double>_> *)&local_108);
  Fad<double>::~Fad((Fad<double> *)&local_108);
  local_58.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.left_.constant_ = RVar1;
  local_78.fadexpr_.right_ = &local_58;
  local_58.fadexpr_.left_.constant_ = RVar2;
  local_58.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_e0;
  FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)local_b8,result->fStore + 1);
  FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr(&local_108,(FadFuncCos<Fad<double>_> *)local_b8);
  Fad<double>::~Fad((Fad<double> *)local_b8);
  local_38.fadexpr_.left_ = &local_78;
  local_38.fadexpr_.right_ = &local_108;
  Fad<double>::operator=(local_98.fStore,&local_38);
  Fad<double>::~Fad(&local_108.fadexpr_.expr_);
  Fad<double>::~Fad((Fad<double> *)(local_e0 + 8));
  RVar1 = this->fR;
  RVar2 = this->fr;
  FadFuncCos<Fad<double>_>::FadFuncCos((FadFuncCos<Fad<double>_> *)&local_108,result->fStore);
  FadExpr<FadFuncCos<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncCos<Fad<double>_>_> *)local_e0,(FadFuncCos<Fad<double>_> *)&local_108);
  Fad<double>::~Fad((Fad<double> *)&local_108);
  local_58.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.left_.defaultVal = 0.0;
  local_78.fadexpr_.left_.constant_ = RVar1;
  local_78.fadexpr_.right_ = &local_58;
  local_58.fadexpr_.left_.constant_ = RVar2;
  local_58.fadexpr_.right_ = (FadExpr<FadFuncCos<Fad<double>_>_> *)local_e0;
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)local_b8,result->fStore + 1);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)&local_108,(FadFuncSin<Fad<double>_> *)local_b8);
  Fad<double>::~Fad((Fad<double> *)local_b8);
  local_38.fadexpr_.left_ = &local_78;
  local_38.fadexpr_.right_ = &local_108;
  Fad<double>::operator=
            (local_98.fStore + 1,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>
              *)&local_38);
  Fad<double>::~Fad(&local_108.fadexpr_.expr_);
  Fad<double>::~Fad((Fad<double> *)(local_e0 + 8));
  RVar1 = this->fr;
  FadFuncSin<Fad<double>_>::FadFuncSin((FadFuncSin<Fad<double>_> *)&local_108,result->fStore);
  FadExpr<FadFuncSin<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSin<Fad<double>_>_> *)local_e0,(FadFuncSin<Fad<double>_> *)&local_108);
  Fad<double>::~Fad((Fad<double> *)&local_108);
  local_a8 = (double *)0x0;
  local_b8._8_8_ = RVar1;
  local_a0 = (FadExpr<FadFuncSin<Fad<double>_>_> *)local_e0;
  Fad<double>::operator=
            (local_98.fStore + 2,
             (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *)local_b8
            );
  Fad<double>::~Fad((Fad<double> *)(local_e0 + 8));
  TPZVec<Fad<double>_>::operator=(result,&local_98);
  local_98._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ee50;
  if (local_98.fStore != (Fad<double> *)0x0) {
    dVar3 = local_98.fStore[-1].defaultVal;
    if (dVar3 != 0.0) {
      lVar4 = (long)dVar3 << 5;
      do {
        Fad<double>::~Fad((Fad<double> *)((long)&local_98.fStore[-1].val_ + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__(&local_98.fStore[-1].defaultVal,(long)dVar3 << 5 | 8);
  }
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &coord,TPZVec<T> &loc,TPZVec<T> &result) const
        {
            TPZGeoTriangle::X(this->fPhiTheta,loc,result);
            TPZVec <T> toro(3,0.0);
            
            toro[0] = (fR + fr*cos(result[0]))*cos(result[1]);
            toro[1] = (fR + fr*cos(result[0]))*sin(result[1]);
            toro[2] = fr*sin(result[0]);		
            result=toro;
        }